

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::ParseCCRange
          (ParseState *this,StringPiece *s,RuneRange *rr,StringPiece *whole_class,
          RegexpStatus *status)

{
  bool bVar1;
  size_type sVar2;
  const_reference pcVar3;
  const_pointer str;
  const_pointer pcVar4;
  const_pointer pcVar5;
  StringPiece local_58;
  undefined1 local_48 [8];
  StringPiece os;
  RegexpStatus *status_local;
  StringPiece *whole_class_local;
  RuneRange *rr_local;
  StringPiece *s_local;
  ParseState *this_local;
  
  local_48 = (undefined1  [8])s->data_;
  os.data_ = (const_pointer)s->size_;
  os.size_ = (size_type)status;
  bVar1 = ParseCCCharacter(this,s,&rr->lo,whole_class,status);
  if (!bVar1) {
    return false;
  }
  sVar2 = StringPiece::size(s);
  if (((sVar2 < 2) || (pcVar3 = StringPiece::operator[](s,0), *pcVar3 != '-')) ||
     (pcVar3 = StringPiece::operator[](s,1), *pcVar3 == ']')) {
    rr->hi = rr->lo;
  }
  else {
    StringPiece::remove_prefix(s,1);
    bVar1 = ParseCCCharacter(this,s,&rr->hi,whole_class,(RegexpStatus *)os.size_);
    if (!bVar1) {
      return false;
    }
    if (rr->hi < rr->lo) {
      RegexpStatus::set_code((RegexpStatus *)os.size_,kRegexpBadCharRange);
      sVar2 = os.size_;
      str = StringPiece::data((StringPiece *)local_48);
      pcVar4 = StringPiece::data(s);
      pcVar5 = StringPiece::data((StringPiece *)local_48);
      StringPiece::StringPiece(&local_58,str,(long)pcVar4 - (long)pcVar5);
      RegexpStatus::set_error_arg((RegexpStatus *)sVar2,&local_58);
      return false;
    }
  }
  return true;
}

Assistant:

bool Regexp::ParseState::ParseCCRange(StringPiece* s, RuneRange* rr,
                                      const StringPiece& whole_class,
                                      RegexpStatus* status) {
  StringPiece os = *s;
  if (!ParseCCCharacter(s, &rr->lo, whole_class, status))
    return false;
  // [a-] means (a|-), so check for final ].
  if (s->size() >= 2 && (*s)[0] == '-' && (*s)[1] != ']') {
    s->remove_prefix(1);  // '-'
    if (!ParseCCCharacter(s, &rr->hi, whole_class, status))
      return false;
    if (rr->hi < rr->lo) {
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(
          StringPiece(os.data(), static_cast<size_t>(s->data() - os.data())));
      return false;
    }
  } else {
    rr->hi = rr->lo;
  }
  return true;
}